

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_table_functions.cpp
# Opt level: O2

void my_bind(duckdb_bind_info info)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int local_c4;
  undefined8 local_c0;
  duckdb_value param;
  size_type local_b0;
  SourceLineInfo local_88;
  duckdb_logical_type type;
  StringRef local_30;
  
  param = (duckdb_value)anon_var_dwarf_148d60;
  local_b0 = 7;
  local_88.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/capi_table_functions.cpp"
  ;
  local_88.line = 0xb;
  Catch::StringRef::StringRef(&local_30,"duckdb_bind_get_parameter_count(info) == 1");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&type,(StringRef *)&param,&local_88,local_30,Normal);
  local_c0 = duckdb_bind_get_parameter_count(info);
  local_88.file = (char *)&local_c0;
  local_c4 = 1;
  Catch::ExprLhs<unsigned_long_const&>::operator==
            ((BinaryExpr<const_unsigned_long_&,_const_int_&> *)&param,
             (ExprLhs<unsigned_long_const&> *)&local_88,&local_c4);
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&type,(ITransientExpression *)&param);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&param);
  Catch::AssertionHandler::complete((AssertionHandler *)&type);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&type);
  type = (duckdb_logical_type)duckdb_create_logical_type(5);
  duckdb_bind_add_result_column(info,"forty_two",type);
  duckdb_destroy_logical_type(&type);
  puVar1 = (undefined8 *)malloc(8);
  param = (duckdb_value)duckdb_bind_get_parameter(info,0);
  uVar2 = duckdb_get_int64(param);
  *puVar1 = uVar2;
  duckdb_destroy_value(&param);
  duckdb_bind_set_bind_data(info,puVar1,free);
  return;
}

Assistant:

void my_bind(duckdb_bind_info info) {
	REQUIRE(duckdb_bind_get_parameter_count(info) == 1);

	duckdb_logical_type type = duckdb_create_logical_type(DUCKDB_TYPE_BIGINT);
	duckdb_bind_add_result_column(info, "forty_two", type);
	duckdb_destroy_logical_type(&type);

	auto my_bind_data = (my_bind_data_struct *)malloc(sizeof(my_bind_data_struct));
	auto param = duckdb_bind_get_parameter(info, 0);
	my_bind_data->size = duckdb_get_int64(param);
	duckdb_destroy_value(&param);

	duckdb_bind_set_bind_data(info, my_bind_data, free);
}